

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void expr_emit_not(Parser *psr,Node *operand)

{
  Primitive PVar1;
  int tmp;
  Node *operand_local;
  Parser *psr_local;
  
  expr_to_jmp(psr,operand);
  PVar1 = (operand->field_1).prim;
  (operand->field_1).prim = (operand->field_1).jmp.false_list;
  (operand->field_1).jmp.false_list = PVar1;
  return;
}

Assistant:

static void expr_emit_not(Parser *psr, Node *operand) {
	// Emit code to convert the operand to a jump, if necessary
	expr_to_jmp(psr, operand);

	// Swap the true and false cases
	int tmp = operand->jmp.true_list;
	operand->jmp.true_list = operand->jmp.false_list;
	operand->jmp.false_list = tmp;
}